

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

int __thiscall amrex::BoxArray::readFrom(BoxArray *this,istream *is)

{
  bool bVar1;
  Box *this_00;
  istream *in_RSI;
  BARef *in_RDI;
  BoxArray *unaff_retaddr;
  int ndims;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  BATransformer *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  IndexType in_stack_ffffffffffffffb4;
  BoxArray *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  BARef *this_01;
  
  this_01 = in_RDI;
  clear(unaff_retaddr);
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0xfb8459
            );
  BARef::define(this_01,in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
  ;
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0xfb8478
            );
  bVar1 = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::empty
                    ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4.itype,in_stack_ffffffffffffffb0));
  if (!bVar1) {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0xfb8491);
    this_00 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                        ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (size_type)in_RDI);
    Box::ixType(this_00);
    BATransformer::BATransformer(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb4);
    memcpy(in_RDI,&stack0xffffffffffffffa4,0x48);
    type_update(in_stack_ffffffffffffffc8);
  }
  return in_stack_ffffffffffffffec;
}

Assistant:

int
BoxArray::readFrom (std::istream& is)
{
    BL_ASSERT(size() == 0);
    clear();
    int ndims;
    m_ref->define(is, ndims);
    if (! m_ref->m_abox.empty()) {
        m_bat = BATransformer(m_ref->m_abox[0].ixType());
        type_update();
    }
    return ndims;
}